

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall Tokenizer::readAll(Tokenizer *this)

{
  bool bVar1;
  istream *piVar2;
  long local_80 [2];
  pair<long,_long> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_30 [8];
  string tp;
  Tokenizer *this_local;
  
  if ((this->_initialized & 1U) == 0) {
    tp.field_2._8_8_ = this;
    std::__cxx11::string::string((string *)local_30);
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (this->_rdr,(string *)local_30);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) break;
      std::operator+(&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     "\n");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->_lines_buffer,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::~string((string *)local_30);
    this->_initialized = true;
    local_80[1] = 0;
    local_80[0] = 0;
    local_70 = std::make_pair<long,long>(local_80 + 1,local_80);
    std::pair<unsigned_long,unsigned_long>::operator=
              ((pair<unsigned_long,unsigned_long> *)&this->_ptr,&local_70);
  }
  return;
}

Assistant:

void Tokenizer::readAll() {
	if (_initialized)
		return;
	for (std::string tp; std::getline(_rdr, tp);)
		_lines_buffer.emplace_back(std::move(tp + "\n"));
	_initialized = true;
	_ptr = std::make_pair<int64_t, int64_t>(0, 0);
	return;
}